

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdFloat32x4OperationX86X64.cpp
# Opt level: O3

SIMDValue Js::SIMDFloat32x4Operation::OpMin(SIMDValue *aValue,SIMDValue *bValue)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar2 = minps((undefined1  [16])aValue->field_0,(undefined1  [16])bValue->field_0);
  auVar1 = minps((undefined1  [16])bValue->field_0,(undefined1  [16])aValue->field_0);
  return (SIMDValue)(anon_union_16_9_4d7543c8_for__SIMDValue_0)(auVar1 | auVar2);
}

Assistant:

SIMDValue SIMDFloat32x4Operation::OpMin(const SIMDValue& aValue, const SIMDValue& bValue)
    {
        X86SIMDValue x86Result;
        X86SIMDValue tmpaValue = X86SIMDValue::ToX86SIMDValue(aValue);
        X86SIMDValue tmpbValue = X86SIMDValue::ToX86SIMDValue(bValue);
        X86SIMDValue tmp1, tmp2;

        // if tmp1 and tmp2 are not identical then either
        // 1) at least one value is NaN, then the OR will set that lane to NaN
        // 2) one value is 0.0 and the other is -0.0, the OR will set the sign bit to have -0.0
        tmp1.m128_value = _mm_min_ps(tmpaValue.m128_value, tmpbValue.m128_value);
        tmp2.m128_value = _mm_min_ps(tmpbValue.m128_value, tmpaValue.m128_value);
        x86Result.m128_value = _mm_or_ps(tmp1.m128_value, tmp2.m128_value);

        return X86SIMDValue::ToSIMDValue(x86Result);
    }